

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O3

StateSet *
Omega_h::get_epsilon_closure(StateSet *__return_storage_ptr__,StateSet *ss,FiniteAutomaton *fa)

{
  _Rb_tree_header *__x;
  int iVar1;
  _Rb_tree_color state_00;
  _Rb_tree_node_base *p_Var2;
  StateSet *extraout_RAX;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  int epsilon;
  int symbol;
  StateSet *__range1;
  int state;
  StateQueue q;
  _Rb_tree_color local_90;
  int local_8c;
  _Deque_base<int,_std::allocator<int>_> local_88;
  StateSet *local_38;
  
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_38 = __return_storage_ptr__;
  std::_Deque_base<int,_std::allocator<int>_>::_M_initialize_map(&local_88,0);
  p_Var2 = (ss->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  __x = &(ss->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != __x) {
    do {
      local_90 = p_Var2[1]._M_color;
      if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                  ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_90);
      }
      else {
        *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
        local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != __x);
  }
  if (fa->is_deterministic == true) {
    fail("assertion %s failed at %s +%d\n","!fa.is_deterministic",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x1f);
  }
  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar1 = (fa->table).ncols;
    local_8c = iVar1 + -2;
    do {
      state_00 = *local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_88._M_impl.super__Deque_impl_data._M_start._M_cur ==
          local_88._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
        operator_delete(local_88._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node[1];
        local_88._M_impl.super__Deque_impl_data._M_start._M_last =
             (_Elt_pointer)
             ((_Rb_tree_color *)local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 0x80);
        symbol = local_8c;
        local_88._M_impl.super__Deque_impl_data._M_start._M_first =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_88._M_impl.super__Deque_impl_data._M_start._M_node =
             local_88._M_impl.super__Deque_impl_data._M_start._M_node + 1;
      }
      else {
        local_88._M_impl.super__Deque_impl_data._M_start._M_cur =
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        symbol = local_8c;
      }
      do {
        local_90 = step(fa,state_00,symbol);
        if (local_90 != ~_S_red) {
          p_Var3 = (ss->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var4 = &__x->_M_header;
          if (p_Var3 != (_Base_ptr)0x0) {
            do {
              if ((int)local_90 <= (int)*(size_t *)(p_Var3 + 1)) {
                p_Var4 = p_Var3;
              }
              p_Var3 = (&p_Var3->_M_left)[(int)*(size_t *)(p_Var3 + 1) < (int)local_90];
            } while (p_Var3 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var4 != __x) &&
               ((int)((_Rb_tree_header *)p_Var4)->_M_node_count <= (int)local_90))
            goto LAB_002c2a40;
          }
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)ss,
                     (int *)&local_90);
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                      ((deque<int,std::allocator<int>> *)&local_88,(int *)&local_90);
          }
          else {
            *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = local_90;
            local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                 local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
          }
        }
LAB_002c2a40:
        symbol = symbol + 1;
      } while (symbol < iVar1);
    } while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_88._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::_Rb_tree_header::_Rb_tree_header(&(local_38->_M_t)._M_impl.super__Rb_tree_header,__x);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_88);
  return extraout_RAX;
}

Assistant:

static StateSet get_epsilon_closure(StateSet ss, FiniteAutomaton const& fa) {
  StateQueue q;
  for (auto state : ss) q.push(state);
  auto epsilon0 = get_epsilon0(fa);
  auto epsilon1 = get_epsilon1(fa);
  while (!q.empty()) {
    auto state = q.front();
    q.pop();
    for (auto epsilon = epsilon0; epsilon <= epsilon1; ++epsilon) {
      auto next_state = step(fa, state, epsilon);
      if (next_state == -1) continue;
      if (!ss.count(next_state)) {
        ss.insert(next_state);
        q.push(next_state);
      }
    }
  }
  return ss;
}